

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::internal::UnitTestImpl::UnshuffleTests(UnitTestImpl *this)

{
  size_type sVar1;
  reference ppTVar2;
  reference pvVar3;
  ulong local_18;
  size_t i;
  UnitTestImpl *this_local;
  
  local_18 = 0;
  while( true ) {
    sVar1 = std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::size
                      (&this->test_suites_);
    if (sVar1 <= local_18) break;
    ppTVar2 = std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::operator[]
                        (&this->test_suites_,local_18);
    TestSuite::UnshuffleTests(*ppTVar2);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&this->test_suite_indices_,local_18)
    ;
    *pvVar3 = (value_type)local_18;
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

void UnitTestImpl::UnshuffleTests() {
  for (size_t i = 0; i < test_suites_.size(); i++) {
    // Unshuffles the tests in each test suite.
    test_suites_[i]->UnshuffleTests();
    // Resets the index of each test suite.
    test_suite_indices_[i] = static_cast<int>(i);
  }
}